

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  int iVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  char *__function;
  ImGuiViewportP *viewport;
  ImGuiWindow *pIVar6;
  float fVar7;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  iVar1 = (GImGui->CurrentWindowStack).Size;
  if ((iVar1 < 2) && (GImGui->WithinFrameScopeWithImplicitWindow == true)) {
    __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1a58,"void ImGui::End()");
  }
  if (iVar1 < 1) {
    __assert_fail("g.CurrentWindowStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1a5b,"void ImGui::End()");
  }
  if ((((window->Flags & 0x21000000U) == 0x1000000) && ((window->field_0x492 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1a5f,"void ImGui::End()");
  }
  if ((window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    EndColumns();
  }
  if ((window->Flags & 0x20000000) == 0) {
    PopClipRect();
  }
  if ((window->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  if (((window->DockNode != (ImGuiDockNode *)0x0) && ((window->field_0x492 & 2) != 0)) &&
     (pIVar6 = window->DockNode->HostWindow, pIVar6 != (ImGuiWindow *)0x0)) {
    IVar3.y = ((window->DC).CursorMaxPos.y + (window->WindowPadding).y) - (pIVar6->WindowPadding).y;
    IVar3.x = ((window->DC).CursorMaxPos.x + (window->WindowPadding).x) - (pIVar6->WindowPadding).x;
    (pIVar6->DC).CursorMaxPos = IVar3;
  }
  iVar1 = (pIVar4->CurrentWindowStack).Size;
  if (0 < iVar1) {
    (pIVar4->CurrentWindowStack).Size = iVar1 + -1;
    if ((window->Flags & 0x4000000) != 0) {
      iVar1 = (pIVar4->BeginPopupStack).Size;
      if (iVar1 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_00130700;
      }
      (pIVar4->BeginPopupStack).Size = iVar1 + -1;
    }
    pIVar6 = (ImGuiWindow *)0x0;
    viewport = (ImGuiViewportP *)0x0;
    ErrorCheckBeginEndCompareStacksSize(window,false);
    pIVar5 = GImGui;
    uVar2 = (pIVar4->CurrentWindowStack).Size;
    if ((ulong)uVar2 != 0) {
      if ((int)uVar2 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5cc,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
      }
      pIVar6 = (pIVar4->CurrentWindowStack).Data[(ulong)uVar2 - 1];
    }
    GImGui->CurrentWindow = pIVar6;
    if (pIVar6 != (ImGuiWindow *)0x0) {
      fVar7 = pIVar5->FontBaseSize * pIVar6->FontWindowScale * pIVar6->FontDpiScale;
      if (pIVar6->ParentWindow != (ImGuiWindow *)0x0) {
        fVar7 = fVar7 * pIVar6->ParentWindow->FontWindowScale;
      }
      (pIVar5->DrawListSharedData).FontSize = fVar7;
      pIVar5->FontSize = fVar7;
    }
    if (pIVar4->CurrentWindow != (ImGuiWindow *)0x0) {
      SetCurrentViewport((ImGuiWindow *)pIVar4->CurrentWindow->Viewport,viewport);
      return;
    }
    return;
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_00130700:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5d8,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}